

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

PFN_vkVoidFunction Fossilize::interceptDeviceCommand(Instance *instance,char *pName)

{
  int iVar1;
  int iVar2;
  long lVar3;
  PFN_vkVoidFunction unaff_R15;
  
  lVar3 = 0x10;
  while( true ) {
    if ((*(char *)((long)&interceptDeviceCommand::coreDeviceCommands[0].name + lVar3) != '\x01') ||
       (iVar2 = 3, instance->shouldRecordImmutableSamplers == true)) {
      iVar1 = strcmp(*(char **)((long)&PTR__GLOBAL__sub_I_dispatch_cpp_001766e0 + lVar3),pName);
      iVar2 = 0;
      if (iVar1 == 0) {
        unaff_R15 = *(PFN_vkVoidFunction *)((long)&__do_global_dtors_aux_fini_array_entry + lVar3);
        iVar2 = 1;
      }
    }
    if ((iVar2 != 3) && (iVar2 != 0)) break;
    lVar3 = lVar3 + 0x18;
    if (lVar3 == 0x178) {
      return (PFN_vkVoidFunction)0x0;
    }
  }
  return unaff_R15;
}

Assistant:

static PFN_vkVoidFunction interceptDeviceCommand(Instance *instance, const char *pName)
{
	static const struct
	{
		const char *name;
		PFN_vkVoidFunction proc;
		bool is_sampler;
	} coreDeviceCommands[] = {
		{ "vkGetDeviceProcAddr", reinterpret_cast<PFN_vkVoidFunction>(VK_LAYER_fossilize_GetDeviceProcAddr) },
		{ "vkDestroyDevice", reinterpret_cast<PFN_vkVoidFunction>(DestroyDevice) },

		{ "vkCreateDescriptorSetLayout", reinterpret_cast<PFN_vkVoidFunction>(CreateDescriptorSetLayout) },
		{ "vkCreatePipelineLayout", reinterpret_cast<PFN_vkVoidFunction>(CreatePipelineLayout) },
		{ "vkCreateGraphicsPipelines", reinterpret_cast<PFN_vkVoidFunction>(CreateGraphicsPipelines) },
		{ "vkCreateComputePipelines", reinterpret_cast<PFN_vkVoidFunction>(CreateComputePipelines) },
		{ "vkCreateSampler", reinterpret_cast<PFN_vkVoidFunction>(CreateSampler), true },
		{ "vkCreateShaderModule", reinterpret_cast<PFN_vkVoidFunction>(CreateShaderModule) },
		{ "vkCreateRenderPass", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass) },
		{ "vkCreateRenderPass2", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass2) },
		{ "vkCreateRenderPass2KHR", reinterpret_cast<PFN_vkVoidFunction>(CreateRenderPass2KHR) },
		{ "vkCreateSamplerYcbcrConversion", reinterpret_cast<PFN_vkVoidFunction>(CreateSamplerYcbcrConversion), true },
		{ "vkCreateSamplerYcbcrConversionKHR", reinterpret_cast<PFN_vkVoidFunction>(CreateSamplerYcbcrConversionKHR), true },
		{ "vkCreateRayTracingPipelinesKHR", reinterpret_cast<PFN_vkVoidFunction>(CreateRayTracingPipelinesKHR) },
		{ "vkCreatePipelineBinariesKHR", reinterpret_cast<PFN_vkVoidFunction>(CreatePipelineBinariesKHR) },
	};

	for (auto &cmd : coreDeviceCommands)
	{
		if (cmd.is_sampler && !instance->recordsImmutableSamplers())
			continue;

		if (strcmp(cmd.name, pName) == 0)
			return cmd.proc;
	}

	return nullptr;
}